

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CropLayerParams::SerializeWithCachedSizes
          (CropLayerParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  unsigned_long *puVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong value;
  ulong uVar8;
  int index;
  uint value_00;
  
  if (this->cropamounts_ != (BorderAmounts *)0x0 &&
      this != (CropLayerParams *)&_CropLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->cropamounts_->super_MessageLite,output);
  }
  if (0 < (this->offset_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x2a);
    }
    else {
      *output->buffer_ = '*';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    value_00 = this->_offset_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar6 = pbVar1;
      uVar7 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar6 = (byte)value_00 | 0x80;
          uVar7 = value_00 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar2 = 0x3fff < value_00;
          value_00 = uVar7;
        } while (bVar2);
      }
      *pbVar6 = (byte)uVar7;
      iVar4 = ((int)pbVar6 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
  }
  iVar4 = (this->offset_).current_size_;
  if (0 < iVar4) {
    index = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->offset_,index);
      value = *puVar3;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar6 = pbVar1;
        uVar8 = value;
        if (0x7f < value) {
          do {
            *pbVar6 = (byte)value | 0x80;
            uVar8 = value >> 7;
            pbVar6 = pbVar6 + 1;
            bVar2 = 0x3fff < value;
            value = uVar8;
          } while (bVar2);
        }
        *pbVar6 = (byte)uVar8;
        iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar5;
        output->buffer_size_ = output->buffer_size_ - iVar5;
      }
      index = index + 1;
    } while (index != iVar4);
  }
  return;
}

Assistant:

void CropLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CropLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.BorderAmounts cropAmounts = 1;
  if (this->has_cropamounts()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->cropamounts_, output);
  }

  // repeated uint64 offset = 5;
  if (this->offset_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_offset_cached_byte_size_);
  }
  for (int i = 0, n = this->offset_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->offset(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CropLayerParams)
}